

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  undefined8 *puVar1;
  byte bVar2;
  byte *pbVar3;
  LiveRegSpans *pLVar4;
  long lVar5;
  ulong uVar6;
  
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    pbVar3 = RARegCount::operator[](&this->_physRegCount,(uint32_t)uVar6);
    bVar2 = *pbVar3;
    if (bVar2 == 0) {
      pLVar4 = (LiveRegSpans *)0x0;
    }
    else {
      pLVar4 = (LiveRegSpans *)ZoneAllocator::alloc(&this->_allocator,(ulong)bVar2 << 4);
      if (pLVar4 == (LiveRegSpans *)0x0) break;
      for (lVar5 = 0; (ulong)bVar2 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
        puVar1 = (undefined8 *)((long)&(pLVar4->_data).super_ZoneVectorBase._data + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
    }
    this->_globalLiveSpans[uVar6] = pLVar4;
  }
  return (Error)(uVar6 < 4);
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(&liveSpans[physId]) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}